

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCSatOld.c
# Opt level: O0

void Cbs0_QueStore(Cbs0_Que_t *p,int *piHeadOld,int *piTailOld)

{
  int local_24;
  int i;
  int *piTailOld_local;
  int *piHeadOld_local;
  Cbs0_Que_t *p_local;
  
  *piHeadOld = p->iHead;
  *piTailOld = p->iTail;
  for (local_24 = *piHeadOld; local_24 < *piTailOld; local_24 = local_24 + 1) {
    Cbs0_QuePush(p,p->pData[local_24]);
  }
  p->iHead = *piTailOld;
  return;
}

Assistant:

static inline void Cbs0_QueStore( Cbs0_Que_t * p, int * piHeadOld, int * piTailOld )
{
    int i;
    *piHeadOld = p->iHead;
    *piTailOld = p->iTail;
    for ( i = *piHeadOld; i < *piTailOld; i++ )
        Cbs0_QuePush( p, p->pData[i] );
    p->iHead = *piTailOld;
}